

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiContext::ImGuiContext(ImGuiContext *this,ImFontAtlas *shared_font_atlas)

{
  void *pvVar1;
  void *pvVar2;
  undefined4 uVar3;
  void *in_RSI;
  undefined1 *in_RDI;
  ImFontAtlas *this_00;
  ImGuiNextWindowData *in_stack_fffffffffffffe00;
  ImPool<ImGuiTable> *in_stack_fffffffffffffe10;
  ImGuiInputTextState *in_stack_fffffffffffffe20;
  ImGuiIO *in_stack_fffffffffffffe50;
  ImGuiStyle *in_stack_fffffffffffffe90;
  ImGuiKeyOwnerData *local_a8;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  undefined1 local_31;
  void *local_30;
  void *local_28;
  void *local_10;
  
  local_10 = in_RSI;
  ImGuiIO::ImGuiIO(in_stack_fffffffffffffe50);
  ImGuiStyle::ImGuiStyle(in_stack_fffffffffffffe90);
  ImDrawListSharedData::ImDrawListSharedData((ImDrawListSharedData *)in_stack_fffffffffffffe50);
  ImVector<ImGuiInputEvent>::ImVector((ImVector<ImGuiInputEvent> *)(in_RDI + 0x3ff0));
  ImVector<ImGuiInputEvent>::ImVector((ImVector<ImGuiInputEvent> *)(in_RDI + 0x4000));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x4018));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x4028));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x4038));
  ImVector<ImGuiWindowStackData>::ImVector((ImVector<ImGuiWindowStackData> *)(in_RDI + 0x4048));
  ImGuiStorage::ImGuiStorage((ImGuiStorage *)0x2121bc);
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x406c));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x40a8));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x40bc));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x40c4));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x40f8));
  ImBitArray<154,_-512>::ImBitArray((ImBitArray<154,__512> *)0x212240);
  local_a8 = (ImGuiKeyOwnerData *)(in_RDI + 0x4154);
  do {
    ImGuiKeyOwnerData::ImGuiKeyOwnerData(local_a8);
    local_a8 = local_a8 + 1;
  } while (local_a8 != (ImGuiKeyOwnerData *)(in_RDI + 0x488c));
  ImGuiKeyRoutingTable::ImGuiKeyRoutingTable((ImGuiKeyRoutingTable *)in_stack_fffffffffffffe20);
  ImGuiNextItemData::ImGuiNextItemData((ImGuiNextItemData *)in_stack_fffffffffffffe00);
  ImGuiLastItemData::ImGuiLastItemData((ImGuiLastItemData *)in_stack_fffffffffffffe00);
  ImGuiNextWindowData::ImGuiNextWindowData(in_stack_fffffffffffffe00);
  ImVector<ImGuiColorMod>::ImVector((ImVector<ImGuiColorMod> *)(in_RDI + 0x4b00));
  ImVector<ImGuiStyleMod>::ImVector((ImVector<ImGuiStyleMod> *)(in_RDI + 0x4b10));
  ImVector<ImFont_*>::ImVector((ImVector<ImFont_*> *)(in_RDI + 0x4b20));
  ImVector<ImGuiFocusScopeData>::ImVector((ImVector<ImGuiFocusScopeData> *)(in_RDI + 0x4b30));
  ImVector<int>::ImVector((ImVector<int> *)(in_RDI + 0x4b40));
  ImVector<ImGuiGroupData>::ImVector((ImVector<ImGuiGroupData> *)(in_RDI + 0x4b50));
  ImVector<ImGuiPopupData>::ImVector((ImVector<ImGuiPopupData> *)(in_RDI + 0x4b60));
  ImVector<ImGuiPopupData>::ImVector((ImVector<ImGuiPopupData> *)(in_RDI + 0x4b70));
  ImVector<ImGuiTreeNodeStackData>::ImVector((ImVector<ImGuiTreeNodeStackData> *)(in_RDI + 0x4b80));
  ImVector<ImGuiViewportP_*>::ImVector((ImVector<ImGuiViewportP_*> *)(in_RDI + 0x4b90));
  ImVector<ImGuiFocusScopeData>::ImVector((ImVector<ImGuiFocusScopeData> *)(in_RDI + 0x4bc8));
  ImGuiNavItemData::ImGuiNavItemData((ImGuiNavItemData *)in_stack_fffffffffffffe00);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe00);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe00);
  ImGuiNavItemData::ImGuiNavItemData((ImGuiNavItemData *)in_stack_fffffffffffffe00);
  ImGuiNavItemData::ImGuiNavItemData((ImGuiNavItemData *)in_stack_fffffffffffffe00);
  ImGuiNavItemData::ImGuiNavItemData((ImGuiNavItemData *)in_stack_fffffffffffffe00);
  ImGuiNavItemData::ImGuiNavItemData((ImGuiNavItemData *)in_stack_fffffffffffffe00);
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x4da8));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x4db0));
  ImGuiPayload::ImGuiPayload((ImGuiPayload *)0x212526);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe00);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe00);
  ImVector<unsigned_char>::ImVector((ImVector<unsigned_char> *)(in_RDI + 0x4e50));
  ImVector<ImGuiListClipperData>::ImVector((ImVector<ImGuiListClipperData> *)(in_RDI + 0x4e78));
  ImVector<ImGuiTableTempData>::ImVector((ImVector<ImGuiTableTempData> *)(in_RDI + 0x4e98));
  ImPool<ImGuiTable>::ImPool(in_stack_fffffffffffffe10);
  ImVector<float>::ImVector((ImVector<float> *)(in_RDI + 0x4ed0));
  ImVector<ImDrawChannel>::ImVector((ImVector<ImDrawChannel> *)(in_RDI + 0x4ee0));
  ImPool<ImGuiTabBar>::ImPool((ImPool<ImGuiTabBar> *)in_stack_fffffffffffffe10);
  ImVector<ImGuiPtrOrIndex>::ImVector((ImVector<ImGuiPtrOrIndex> *)(in_RDI + 0x4f20));
  ImVector<ImGuiShrinkWidthItem>::ImVector((ImVector<ImGuiShrinkWidthItem> *)(in_RDI + 0x4f30));
  ImGuiBoxSelectState::ImGuiBoxSelectState((ImGuiBoxSelectState *)in_stack_fffffffffffffe00);
  ImVector<ImGuiMultiSelectTempData>::ImVector
            ((ImVector<ImGuiMultiSelectTempData> *)(in_RDI + 0x4fb8));
  ImPool<ImGuiMultiSelectState>::ImPool((ImPool<ImGuiMultiSelectState> *)in_stack_fffffffffffffe10);
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x5010));
  ImGuiInputTextState::ImGuiInputTextState(in_stack_fffffffffffffe20);
  ImGuiInputTextDeactivatedState::ImGuiInputTextDeactivatedState
            ((ImGuiInputTextDeactivatedState *)in_stack_fffffffffffffe00);
  ImFont::ImFont((ImFont *)in_stack_fffffffffffffe20);
  ImVec4::ImVec4((ImVec4 *)(in_RDI + 0x5f6c));
  ImGuiComboPreviewData::ImGuiComboPreviewData((ImGuiComboPreviewData *)in_stack_fffffffffffffe00);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe00);
  ImVector<char>::ImVector((ImVector<char> *)(in_RDI + 0x5fe8));
  ImVector<unsigned_int>::ImVector((ImVector<unsigned_int> *)(in_RDI + 0x5ff8));
  ImGuiTypingSelectState::ImGuiTypingSelectState((ImGuiTypingSelectState *)0x2127b0);
  ImGuiPlatformImeData::ImGuiPlatformImeData((ImGuiPlatformImeData *)in_stack_fffffffffffffe00);
  ImGuiPlatformImeData::ImGuiPlatformImeData((ImGuiPlatformImeData *)in_stack_fffffffffffffe00);
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x2127f7);
  ImVector<ImGuiSettingsHandler>::ImVector((ImVector<ImGuiSettingsHandler> *)(in_RDI + 0x60a8));
  ImChunkStream<ImGuiWindowSettings>::ImChunkStream((ImChunkStream<ImGuiWindowSettings> *)0x21282d);
  ImChunkStream<ImGuiTableSettings>::ImChunkStream((ImChunkStream<ImGuiTableSettings> *)0x212848);
  this_00 = (ImFontAtlas *)(in_RDI + 0x60d8);
  ImVector<ImGuiContextHook>::ImVector((ImVector<ImGuiContextHook> *)this_00);
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x21287e);
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x212899);
  ImGuiTextIndex::ImGuiTextIndex((ImGuiTextIndex *)in_stack_fffffffffffffe00);
  ImVec4::ImVec4((ImVec4 *)(in_RDI + 0x61c0));
  ImGuiMetricsConfig::ImGuiMetricsConfig((ImGuiMetricsConfig *)(in_RDI + 0x61d0));
  ImGuiIDStackTool::ImGuiIDStackTool((ImGuiIDStackTool *)in_stack_fffffffffffffe00);
  ImGuiDebugAllocInfo::ImGuiDebugAllocInfo((ImGuiDebugAllocInfo *)0x21290f);
  ImVector<char>::ImVector((ImVector<char> *)(in_RDI + 0x6360));
  *(undefined1 **)(in_RDI + 0x108) = in_RDI;
  *(undefined1 **)(in_RDI + 0x5018) = in_RDI;
  *in_RDI = 0;
  in_RDI[1] = -(local_10 == (void *)0x0) & 1;
  *(undefined8 *)(in_RDI + 0x3d88) = 0;
  *(undefined4 *)(in_RDI + 0x3d9c) = 0;
  *(undefined4 *)(in_RDI + 0x3d98) = 0;
  *(undefined4 *)(in_RDI + 0x3d94) = 0;
  *(undefined4 *)(in_RDI + 0x3d90) = 0;
  local_31 = 0;
  if (local_10 == (void *)0x0) {
    pvVar1 = ImGui::MemAlloc((size_t)in_stack_fffffffffffffe00);
    pvVar2 = operator_new(0x4a0);
    local_31 = 1;
    local_30 = pvVar1;
    local_28 = pvVar2;
    ImFontAtlas::ImFontAtlas(this_00);
    local_10 = pvVar2;
  }
  *(void **)(in_RDI + 0x38) = local_10;
  *(undefined8 *)(in_RDI + 0x3fb8) = 0;
  *(undefined4 *)(in_RDI + 0x3fc0) = 0;
  *(undefined4 *)(in_RDI + 0x3fc8) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x3fc4) = 0xffffffff;
  in_RDI[0x3fce] = 0;
  in_RDI[0x3fcd] = 0;
  in_RDI[0x3fcc] = 0;
  in_RDI[0x3fcf] = 0;
  in_RDI[0x3fd0] = 0;
  *(undefined8 *)(in_RDI + 0x3fd8) = 0;
  *(undefined8 *)(in_RDI + 0x3fe0) = 0;
  *(undefined8 *)(in_RDI + 0x3fe8) = 0;
  *(undefined4 *)(in_RDI + 0x4010) = 0;
  *(undefined4 *)(in_RDI + 0x4014) = 1;
  *(undefined4 *)(in_RDI + 0x4068) = 0;
  *(undefined8 *)(in_RDI + 0x4078) = 0;
  *(undefined8 *)(in_RDI + 0x4080) = 0;
  *(undefined8 *)(in_RDI + 0x4088) = 0;
  *(undefined8 *)(in_RDI + 0x4090) = 0;
  *(undefined8 *)(in_RDI + 0x4098) = 0;
  *(undefined8 *)(in_RDI + 0x40a0) = 0;
  *(undefined4 *)(in_RDI + 0x40b4) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x40b0) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x40b8) = 0;
  *(undefined4 *)(in_RDI + 0x40cc) = 0;
  *(undefined4 *)(in_RDI + 0x40d4) = 0;
  *(undefined4 *)(in_RDI + 0x40d0) = 0;
  in_RDI[0x40e0] = 0;
  in_RDI[0x40e1] = 0;
  *(undefined4 *)(in_RDI + 0x40dc) = 0;
  *(undefined4 *)(in_RDI + 0x40d8) = 0;
  in_RDI[0x40e2] = 0;
  *(undefined4 *)(in_RDI + 0x40e4) = 0;
  *(undefined4 *)(in_RDI + 0x40e8) = 0;
  *(undefined4 *)(in_RDI + 0x40ec) = 0;
  in_RDI[0x40f0] = 0;
  in_RDI[0x40f1] = 0;
  in_RDI[0x40f2] = 0;
  in_RDI[0x40f3] = 0;
  in_RDI[0x40f4] = 0;
  in_RDI[0x40f5] = 0;
  in_RDI[0x40f6] = 0;
  ImVec2::ImVec2(&local_3c,-1.0,-1.0);
  *(ImVec2 *)(in_RDI + 0x40f8) = local_3c;
  *(undefined8 *)(in_RDI + 0x4100) = 0;
  *(undefined4 *)(in_RDI + 0x4108) = 0;
  in_RDI[0x40f7] = 0xff;
  *(undefined4 *)(in_RDI + 0x410c) = 0;
  in_RDI[0x4110] = 0;
  in_RDI[0x4111] = 0;
  *(undefined8 *)(in_RDI + 0x4118) = 0;
  *(undefined4 *)(in_RDI + 0x4120) = 0;
  *(undefined4 *)(in_RDI + 0x4124) = 0;
  *(undefined8 *)(in_RDI + 0x4130) = 0xbff0000000000000;
  *(undefined8 *)(in_RDI + 0x4128) = 0xbff0000000000000;
  *(undefined8 *)(in_RDI + 0x4138) = 0xbff0000000000000;
  *(undefined4 *)(in_RDI + 0x49e8) = 0;
  in_RDI[0x49ec] = 0;
  *(undefined4 *)(in_RDI + 0x49f4) = 0;
  *(undefined4 *)(in_RDI + 0x49f8) = 0;
  in_RDI[0x4af8] = 0;
  *(undefined8 *)(in_RDI + 0x4ba0) = 0;
  *(undefined4 *)(in_RDI + 0x4bbc) = 0;
  *(undefined4 *)(in_RDI + 0x4bb8) = 0;
  *(undefined4 *)(in_RDI + 0x4bb4) = 0;
  *(undefined4 *)(in_RDI + 0x4bac) = 0;
  *(undefined4 *)(in_RDI + 0x4ba8) = 0;
  *(undefined4 *)(in_RDI + 0x4bb0) = 0;
  *(undefined4 *)(in_RDI + 0x4be0) = 0;
  *(undefined4 *)(in_RDI + 0x4be4) = 0;
  *(undefined4 *)(in_RDI + 0x4bc0) = 0;
  *(undefined4 *)(in_RDI + 0x4bd8) = 0;
  *(undefined4 *)(in_RDI + 0x4bdc) = 0;
  *(undefined4 *)(in_RDI + 0x4be8) = 2;
  *(undefined8 *)(in_RDI + 0x4bf0) = 0xffffffffffffffff;
  in_RDI[0x4bf8] = 0;
  in_RDI[0x4bf9] = 0;
  in_RDI[0x4bfa] = 1;
  in_RDI[0x4bfb] = 0;
  in_RDI[0x4bfc] = 0;
  in_RDI[0x4bfd] = 0;
  in_RDI[0x4bfe] = 0;
  in_RDI[0x4c38] = 0;
  in_RDI[0x4c39] = 0;
  in_RDI[0x4c3a] = 0;
  *(undefined4 *)(in_RDI + 0x4c3c) = 0;
  *(undefined4 *)(in_RDI + 0x4c40) = 0;
  *(undefined4 *)(in_RDI + 0x4c44) = 0;
  *(undefined4 *)(in_RDI + 0x4c50) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x4c4c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x4c48) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x4c74) = 0;
  *(undefined4 *)(in_RDI + 0x4c78) = 0;
  *(undefined4 *)(in_RDI + 0x4c7c) = 0;
  *(undefined4 *)(in_RDI + 0x4d68) = 0;
  *(undefined4 *)(in_RDI + 0x4d64) = 0;
  *(undefined4 *)(in_RDI + 0x4d60) = 0;
  *(undefined4 *)(in_RDI + 0x4d6c) = 0;
  in_RDI[0x4d70] = 0;
  in_RDI[0x4d71] = 0;
  uVar3 = 0x1200;
  if ((in_RDI[0x59] & 1) != 0) {
    uVar3 = 0x8200;
  }
  *(undefined4 *)(in_RDI + 0x4d74) = uVar3;
  uVar3 = 0x3200;
  if ((in_RDI[0x59] & 1) != 0) {
    uVar3 = 0xa200;
  }
  *(undefined4 *)(in_RDI + 0x4d78) = uVar3;
  *(undefined8 *)(in_RDI + 0x4d90) = 0;
  *(undefined8 *)(in_RDI + 0x4d88) = 0;
  *(undefined8 *)(in_RDI + 0x4d80) = 0;
  *(undefined4 *)(in_RDI + 0x4d9c) = 0;
  *(undefined4 *)(in_RDI + 0x4d98) = 0;
  in_RDI[0x4da0] = 0;
  *(undefined4 *)(in_RDI + 0x4da4) = 0;
  *(undefined4 *)(in_RDI + 0x4db8) = 0;
  in_RDI[0x4dbe] = 0;
  in_RDI[0x4dbd] = 0;
  in_RDI[0x4dbc] = 0;
  *(undefined4 *)(in_RDI + 0x4dc0) = 0;
  *(undefined4 *)(in_RDI + 0x4dc4) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x4dc8) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x4e30) = 0;
  *(undefined4 *)(in_RDI + 0x4e34) = 0;
  *(undefined4 *)(in_RDI + 0x4e38) = 0;
  *(undefined4 *)(in_RDI + 0x4e3c) = 0;
  *(undefined4 *)(in_RDI + 0x4e40) = 0;
  *(undefined4 *)(in_RDI + 0x4e44) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x4e48) = 0;
  *(undefined8 *)(in_RDI + 0x4e60) = 0;
  *(undefined8 *)(in_RDI + 0x4e68) = 0;
  *(undefined4 *)(in_RDI + 0x4e70) = 0;
  *(undefined8 *)(in_RDI + 0x4e88) = 0;
  *(undefined4 *)(in_RDI + 0x4e94) = 0;
  *(undefined8 *)(in_RDI + 0x4ef0) = 0;
  *(undefined8 *)(in_RDI + 0x4fa8) = 0;
  *(undefined4 *)(in_RDI + 0x4fb0) = 0;
  *(undefined4 *)(in_RDI + 0x5004) = 0;
  *(undefined4 *)(in_RDI + 0x5000) = 0;
  *(undefined4 *)(in_RDI + 0x4ff4) = 0;
  *(undefined4 *)(in_RDI + 0x4ff0) = 0;
  *(undefined4 *)(in_RDI + 0x4ffc) = 0;
  *(undefined4 *)(in_RDI + 0x4ff8) = 0;
  *(undefined4 *)(in_RDI + 0x5008) = 0;
  *(undefined4 *)(in_RDI + 0x500c) = 0;
  *(undefined4 *)(in_RDI + 0x5f40) = 0;
  *(undefined8 *)(in_RDI + 0x5f44) = 0;
  *(undefined4 *)(in_RDI + 0x5f50) = 0;
  *(undefined4 *)(in_RDI + 0x5f4c) = 0;
  *(undefined4 *)(in_RDI + 0x5f54) = 0xa900000;
  *(undefined4 *)(in_RDI + 0x5f5c) = 0;
  *(undefined4 *)(in_RDI + 0x5f58) = 0;
  *(undefined4 *)(in_RDI + 0x5f64) = 0;
  *(undefined4 *)(in_RDI + 0x5f60) = 0;
  *(undefined4 *)(in_RDI + 0x5f68) = 0;
  in_RDI[0x5fbc] = 0;
  *(undefined2 *)(in_RDI + 0x5fbe) = 0;
  *(undefined4 *)(in_RDI + 0x5fc0) = 0;
  *(undefined4 *)(in_RDI + 0x5fc4) = 0;
  *(undefined4 *)(in_RDI + 0x5fc8) = 0;
  in_RDI[0x5fcc] = 0;
  in_RDI[0x5fcd] = 0;
  *(undefined4 *)(in_RDI + 0x5fd0) = 0;
  *(undefined4 *)(in_RDI + 0x5fd4) = 0x3c23d70a;
  *(undefined4 *)(in_RDI + 0x5fd8) = 0;
  *(undefined2 *)(in_RDI + 0x5fdc) = 0;
  *(undefined2 *)(in_RDI + 0x5fde) = 0;
  *(undefined2 *)(in_RDI + 0x5fe0) = 0;
  ImVec2::ImVec2(&local_44,0.0,0.0);
  *(ImVec2 *)(in_RDI + 0x6074) = local_44;
  ImVec2::ImVec2(&local_4c,-1.0,-1.0);
  *(ImVec2 *)(in_RDI + 0x6084) = local_4c;
  in_RDI[0x6090] = 0;
  *(undefined4 *)(in_RDI + 0x6094) = 0;
  *(undefined4 *)(in_RDI + 0x60e8) = 0;
  memset(in_RDI + 0x60f0,0,0x48);
  in_RDI[0x6138] = 0;
  *(undefined4 *)(in_RDI + 0x613c) = 0;
  *(undefined8 *)(in_RDI + 0x6160) = 0;
  *(undefined8 *)(in_RDI + 0x6158) = 0;
  *(undefined8 *)(in_RDI + 0x6140) = 0;
  *(undefined4 *)(in_RDI + 0x6168) = 0x7f7fffff;
  in_RDI[0x616c] = 0;
  *(undefined4 *)(in_RDI + 0x6170) = 0;
  *(undefined4 *)(in_RDI + 0x6178) = 2;
  *(undefined4 *)(in_RDI + 0x6174) = 2;
  *(undefined4 *)(in_RDI + 0x617c) = 0x100000;
  *(undefined4 *)(in_RDI + 0x49fc) = 0;
  *(undefined4 *)(in_RDI + 25000) = 0;
  in_RDI[0x61ac] = 0;
  in_RDI[0x61ad] = 0;
  in_RDI[0x61b4] = 0xff;
  in_RDI[0x61b5] = 0;
  in_RDI[0x61b6] = 0;
  *(undefined4 *)(in_RDI + 0x61b8) = 0;
  *(undefined4 *)(in_RDI + 0x61bc) = 0;
  *(undefined4 *)(in_RDI + 0x4afc) = 0x38;
  *(undefined4 *)(in_RDI + 0x4074) = 0;
  *(undefined4 *)(in_RDI + 0x4e90) = 0;
  in_RDI[0x61ae] = 0;
  *(undefined4 *)(in_RDI + 0x61b0) = 0x263;
  *(undefined4 *)(in_RDI + 0x49f0) = 0;
  memset(in_RDI + 0x6254,0,0xf0);
  *(undefined4 *)(in_RDI + 0x6348) = 0;
  *(undefined4 *)(in_RDI + 0x6344) = 0;
  *(undefined4 *)(in_RDI + 0x634c) = 0;
  *(undefined4 *)(in_RDI + 0x6358) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x6354) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x6350) = 0xffffffff;
  memset(in_RDI + 0x6370,0,0x40);
  return;
}

Assistant:

ImGuiContext(ImFontAtlas* shared_font_atlas)
    {
        IO.Ctx = this;
        InputTextState.Ctx = this;

        Initialized = false;
        FontAtlasOwnedByContext = shared_font_atlas ? false : true;
        Font = NULL;
        FontSize = FontBaseSize = FontScale = CurrentDpiScale = 0.0f;
        IO.Fonts = shared_font_atlas ? shared_font_atlas : IM_NEW(ImFontAtlas)();
        Time = 0.0f;
        FrameCount = 0;
        FrameCountEnded = FrameCountRendered = -1;
        WithinFrameScope = WithinFrameScopeWithImplicitWindow = WithinEndChild = false;
        GcCompactAll = false;
        TestEngineHookItems = false;
        TestEngine = NULL;
        memset(ContextName, 0, sizeof(ContextName));

        InputEventsNextMouseSource = ImGuiMouseSource_Mouse;
        InputEventsNextEventId = 1;

        WindowsActiveCount = 0;
        CurrentWindow = NULL;
        HoveredWindow = NULL;
        HoveredWindowUnderMovingWindow = NULL;
        HoveredWindowBeforeClear = NULL;
        MovingWindow = NULL;
        WheelingWindow = NULL;
        WheelingWindowStartFrame = WheelingWindowScrolledFrame = -1;
        WheelingWindowReleaseTimer = 0.0f;

        DebugHookIdInfo = 0;
        HoveredId = HoveredIdPreviousFrame = 0;
        HoveredIdAllowOverlap = false;
        HoveredIdIsDisabled = false;
        HoveredIdTimer = HoveredIdNotActiveTimer = 0.0f;
        ItemUnclipByLog = false;
        ActiveId = 0;
        ActiveIdIsAlive = 0;
        ActiveIdTimer = 0.0f;
        ActiveIdIsJustActivated = false;
        ActiveIdAllowOverlap = false;
        ActiveIdNoClearOnFocusLoss = false;
        ActiveIdHasBeenPressedBefore = false;
        ActiveIdHasBeenEditedBefore = false;
        ActiveIdHasBeenEditedThisFrame = false;
        ActiveIdFromShortcut = false;
        ActiveIdClickOffset = ImVec2(-1, -1);
        ActiveIdWindow = NULL;
        ActiveIdSource = ImGuiInputSource_None;
        ActiveIdMouseButton = -1;
        ActiveIdPreviousFrame = 0;
        ActiveIdPreviousFrameIsAlive = false;
        ActiveIdPreviousFrameHasBeenEditedBefore = false;
        ActiveIdPreviousFrameWindow = NULL;
        LastActiveId = 0;
        LastActiveIdTimer = 0.0f;

        LastKeyboardKeyPressTime = LastKeyModsChangeTime = LastKeyModsChangeFromNoneTime = -1.0;

        ActiveIdUsingNavDirMask = 0x00;
        ActiveIdUsingAllKeyboardKeys = false;

        CurrentFocusScopeId = 0;
        CurrentItemFlags = ImGuiItemFlags_None;
        DebugShowGroupRects = false;

        NavWindow = NULL;
        NavId = NavFocusScopeId = NavActivateId = NavActivateDownId = NavActivatePressedId = 0;
        NavLayer = ImGuiNavLayer_Main;
        NavNextActivateId = 0;
        NavActivateFlags = NavNextActivateFlags = ImGuiActivateFlags_None;
        NavHighlightActivatedId = 0;
        NavHighlightActivatedTimer = 0.0f;
        NavInputSource = ImGuiInputSource_Keyboard;
        NavLastValidSelectionUserData = ImGuiSelectionUserData_Invalid;
        NavIdIsAlive = false;
        NavMousePosDirty = false;
        NavDisableHighlight = true;
        NavDisableMouseHover = false;

        NavAnyRequest = false;
        NavInitRequest = false;
        NavInitRequestFromMove = false;
        NavMoveSubmitted = false;
        NavMoveScoringItems = false;
        NavMoveForwardToNextFrame = false;
        NavMoveFlags = ImGuiNavMoveFlags_None;
        NavMoveScrollFlags = ImGuiScrollFlags_None;
        NavMoveKeyMods = ImGuiMod_None;
        NavMoveDir = NavMoveDirForDebug = NavMoveClipDir = ImGuiDir_None;
        NavScoringDebugCount = 0;
        NavTabbingDir = 0;
        NavTabbingCounter = 0;

        NavJustMovedFromFocusScopeId = NavJustMovedToId = NavJustMovedToFocusScopeId = 0;
        NavJustMovedToKeyMods = ImGuiMod_None;
        NavJustMovedToIsTabbing = false;
        NavJustMovedToHasSelectionData = false;

        // All platforms use Ctrl+Tab but Ctrl<>Super are swapped on Mac...
        // FIXME: Because this value is stored, it annoyingly interfere with toggling io.ConfigMacOSXBehaviors updating this..
        ConfigNavWindowingKeyNext = IO.ConfigMacOSXBehaviors ? (ImGuiMod_Super | ImGuiKey_Tab) : (ImGuiMod_Ctrl | ImGuiKey_Tab);
        ConfigNavWindowingKeyPrev = IO.ConfigMacOSXBehaviors ? (ImGuiMod_Super | ImGuiMod_Shift | ImGuiKey_Tab) : (ImGuiMod_Ctrl | ImGuiMod_Shift | ImGuiKey_Tab);
        NavWindowingTarget = NavWindowingTargetAnim = NavWindowingListWindow = NULL;
        NavWindowingTimer = NavWindowingHighlightAlpha = 0.0f;
        NavWindowingToggleLayer = false;
        NavWindowingToggleKey = ImGuiKey_None;

        DimBgRatio = 0.0f;

        DragDropActive = DragDropWithinSource = DragDropWithinTarget = false;
        DragDropSourceFlags = ImGuiDragDropFlags_None;
        DragDropSourceFrameCount = -1;
        DragDropMouseButton = -1;
        DragDropTargetId = 0;
        DragDropAcceptFlags = ImGuiDragDropFlags_None;
        DragDropAcceptIdCurrRectSurface = 0.0f;
        DragDropAcceptIdPrev = DragDropAcceptIdCurr = 0;
        DragDropAcceptFrameCount = -1;
        DragDropHoldJustPressedId = 0;
        memset(DragDropPayloadBufLocal, 0, sizeof(DragDropPayloadBufLocal));

        ClipperTempDataStacked = 0;

        CurrentTable = NULL;
        TablesTempDataStacked = 0;
        CurrentTabBar = NULL;
        CurrentMultiSelect = NULL;
        MultiSelectTempDataStacked = 0;

        HoverItemDelayId = HoverItemDelayIdPreviousFrame = HoverItemUnlockedStationaryId = HoverWindowUnlockedStationaryId = 0;
        HoverItemDelayTimer = HoverItemDelayClearTimer = 0.0f;

        MouseCursor = ImGuiMouseCursor_Arrow;
        MouseStationaryTimer = 0.0f;

        TempInputId = 0;
        memset(&DataTypeZeroValue, 0, sizeof(DataTypeZeroValue));
        BeginMenuDepth = BeginComboDepth = 0;
        ColorEditOptions = ImGuiColorEditFlags_DefaultOptions_;
        ColorEditCurrentID = ColorEditSavedID = 0;
        ColorEditSavedHue = ColorEditSavedSat = 0.0f;
        ColorEditSavedColor = 0;
        WindowResizeRelativeMode = false;
        ScrollbarSeekMode = 0;
        ScrollbarClickDeltaToGrabCenter = 0.0f;
        SliderGrabClickOffset = 0.0f;
        SliderCurrentAccum = 0.0f;
        SliderCurrentAccumDirty = false;
        DragCurrentAccumDirty = false;
        DragCurrentAccum = 0.0f;
        DragSpeedDefaultRatio = 1.0f / 100.0f;
        DisabledAlphaBackup = 0.0f;
        DisabledStackSize = 0;
        LockMarkEdited = 0;
        TooltipOverrideCount = 0;

        PlatformImeData.InputPos = ImVec2(0.0f, 0.0f);
        PlatformImeDataPrev.InputPos = ImVec2(-1.0f, -1.0f); // Different to ensure initial submission

        SettingsLoaded = false;
        SettingsDirtyTimer = 0.0f;
        HookIdNext = 0;

        memset(LocalizationTable, 0, sizeof(LocalizationTable));

        LogEnabled = false;
        LogType = ImGuiLogType_None;
        LogNextPrefix = LogNextSuffix = NULL;
        LogFile = NULL;
        LogLinePosY = FLT_MAX;
        LogLineFirstItem = false;
        LogDepthRef = 0;
        LogDepthToExpand = LogDepthToExpandDefault = 2;

        DebugLogFlags = ImGuiDebugLogFlags_OutputToTTY;
        DebugLocateId = 0;
        DebugLogAutoDisableFlags = ImGuiDebugLogFlags_None;
        DebugLogAutoDisableFrames = 0;
        DebugLocateFrames = 0;
        DebugBeginReturnValueCullDepth = -1;
        DebugItemPickerActive = false;
        DebugItemPickerMouseButton = ImGuiMouseButton_Left;
        DebugItemPickerBreakId = 0;
        DebugFlashStyleColorTime = 0.0f;
        DebugFlashStyleColorIdx = ImGuiCol_COUNT;

        // Same as DebugBreakClearData(). Those fields are scattered in their respective subsystem to stay in hot-data locations
        DebugBreakInWindow = 0;
        DebugBreakInTable = 0;
        DebugBreakInLocateId = false;
        DebugBreakKeyChord = ImGuiKey_Pause;
        DebugBreakInShortcutRouting = ImGuiKey_None;

        memset(FramerateSecPerFrame, 0, sizeof(FramerateSecPerFrame));
        FramerateSecPerFrameIdx = FramerateSecPerFrameCount = 0;
        FramerateSecPerFrameAccum = 0.0f;
        WantCaptureMouseNextFrame = WantCaptureKeyboardNextFrame = WantTextInputNextFrame = -1;
        memset(TempKeychordName, 0, sizeof(TempKeychordName));
    }